

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O0

string * ZXing::NormalizeName_abi_cxx11_(string_view sv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  string *in_RDI;
  string *str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined8 local_60;
  allocator<char> local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_1a);
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  uVar3 = std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ZXing::NormalizeName(std::basic_string_view<char,std::char_traits<char>>)::__0>
            (uVar1,uVar2,uVar3);
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  this = std::
         remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ZXing::NormalizeName(std::basic_string_view<char,std::char_traits<char>>)::__1>
                   (uVar1,uVar2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this._M_current,in_stack_ffffffffffffff38);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this._M_current,in_stack_ffffffffffffff38);
  std::__cxx11::string::erase(in_RDI,local_60,in_stack_ffffffffffffff78);
  return in_RDI;
}

Assistant:

static std::string NormalizeName(std::string_view sv)
{
	std::string str(sv);
	std::transform(str.begin(), str.end(), str.begin(), [](char c) { return (char)std::tolower(c); });
	str.erase(std::remove_if(str.begin(), str.end(), [](char c) { return Contains("_-[] ", c); }), str.end());
	return str;
}